

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

double __thiscall ON_PlaneEquation::ZeroTolerance(ON_PlaneEquation *this)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ON_3dVector Y;
  ON_3dVector N;
  ON_3dVector X;
  ON_3dPoint P;
  ON_3dVector local_158;
  ON_3dVector local_140;
  ON_3dVector local_128;
  ON_3dPoint local_110;
  ON_3dPoint local_f8;
  ON_3dPoint local_e0;
  ON_3dPoint local_c8;
  ON_3dPoint local_b0;
  ON_3dPoint local_98;
  ON_3dPoint local_80;
  ON_3dPoint local_68;
  ON_3dVector local_50;
  ON_3dPoint local_38;
  
  ON_3dVector::ON_3dVector(&local_128,this->x,this->y,this->z);
  bVar1 = ON_3dVector::Unitize(&local_128);
  dVar3 = 0.0;
  if ((bVar1) && (ABS(this->d) < 1.23432101234321e+308)) {
    dVar3 = -this->d;
    ON_3dPoint::ON_3dPoint(&local_38,local_128.x * dVar3,local_128.y * dVar3,dVar3 * local_128.z);
    dVar4 = ABS(this->z * local_38.z + this->x * local_38.x + local_38.y * this->y + this->d);
    ON_3dVector::PerpendicularTo(&local_50,&local_128);
    ON_3dVector::Unitize(&local_50);
    ON_3dPoint::ON_3dPoint
              (&local_68,local_38.x + local_50.x,local_38.y + local_50.y,local_38.z + local_50.z);
    dVar3 = ABS(this->z * local_68.z + this->x * local_68.x + this->y * local_68.y + this->d);
    if (dVar3 <= dVar4) {
      dVar3 = dVar4;
    }
    ON_3dPoint::ON_3dPoint
              (&local_80,local_38.x - local_50.x,local_38.y - local_50.y,local_38.z - local_50.z);
    dVar4 = this->d;
    dVar2 = ABS(this->z * local_80.z + this->x * local_80.x + this->y * local_80.y + dVar4);
    if (dVar2 <= dVar3) {
      dVar2 = dVar3;
    }
    ON_3dVector::ON_3dVector(&local_158,local_50.x * dVar4,local_50.y * dVar4,dVar4 * local_50.z);
    ON_3dPoint::ON_3dPoint
              (&local_98,local_38.x + local_158.x,local_38.y + local_158.y,local_38.z + local_158.z)
    ;
    dVar3 = this->d;
    dVar4 = ABS(this->z * local_98.z + this->x * local_98.x + this->y * local_98.y + dVar3);
    if (dVar4 <= dVar2) {
      dVar4 = dVar2;
    }
    ON_3dVector::ON_3dVector(&local_158,local_50.x * dVar3,local_50.y * dVar3,dVar3 * local_50.z);
    ON_3dPoint::ON_3dPoint
              (&local_b0,local_38.x - local_158.x,local_38.y - local_158.y,local_38.z - local_158.z)
    ;
    dVar3 = ABS(this->z * local_b0.z + this->x * local_b0.x + this->y * local_b0.y + this->d);
    if (dVar3 <= dVar4) {
      dVar3 = dVar4;
    }
    ON_3dVector::ON_3dVector
              (&local_158,local_128.y * local_50.z - local_128.z * local_50.y,
               local_128.z * local_50.x - local_50.z * local_128.x,
               local_128.x * local_50.y - local_128.y * local_50.x);
    ON_3dVector::Unitize(&local_158);
    ON_3dPoint::ON_3dPoint
              (&local_c8,local_38.x + local_158.x,local_38.y + local_158.y,local_38.z + local_158.z)
    ;
    dVar4 = ABS(this->z * local_c8.z + this->x * local_c8.x + this->y * local_c8.y + this->d);
    if (dVar4 <= dVar3) {
      dVar4 = dVar3;
    }
    ON_3dPoint::ON_3dPoint
              (&local_e0,local_38.x - local_158.x,local_38.y - local_158.y,local_38.z - local_158.z)
    ;
    dVar3 = this->d;
    dVar2 = ABS(this->z * local_e0.z + this->x * local_e0.x + this->y * local_e0.y + dVar3);
    if (dVar2 <= dVar4) {
      dVar2 = dVar4;
    }
    ON_3dVector::ON_3dVector(&local_140,local_158.x * dVar3,local_158.y * dVar3,dVar3 * local_158.z)
    ;
    ON_3dPoint::ON_3dPoint
              (&local_f8,local_38.x + local_140.x,local_38.y + local_140.y,local_38.z + local_140.z)
    ;
    dVar3 = this->d;
    dVar4 = ABS(this->z * local_f8.z + this->x * local_f8.x + this->y * local_f8.y + dVar3);
    if (dVar4 <= dVar2) {
      dVar4 = dVar2;
    }
    ON_3dVector::ON_3dVector(&local_140,local_158.x * dVar3,local_158.y * dVar3,dVar3 * local_158.z)
    ;
    ON_3dPoint::ON_3dPoint
              (&local_110,local_38.x - local_140.x,local_38.y - local_140.y,local_38.z - local_140.z
              );
    dVar3 = ABS(this->z * local_110.z + this->x * local_110.x + this->y * local_110.y + this->d);
    if (dVar3 <= dVar4) {
      dVar3 = dVar4;
    }
  }
  return dVar3;
}

Assistant:

double ON_PlaneEquation::ZeroTolerance() const
{
  double zero_tolerance = 0.0;
  ON_3dVector N(x,y,z);
  if ( N.Unitize() && ON_IS_VALID(d) )
  {
    const ON_3dPoint P( -d*N.x, -d*N.y, -d*N.z  );

    zero_tolerance = fabs(ValueAt(P));

    ON_3dVector X;
    X.PerpendicularTo(N);
    X.Unitize();
    
    double t = fabs(ValueAt(P+X));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P-X));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P+d*X));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P-d*X));
    if ( t > zero_tolerance )
      zero_tolerance = t;

    ON_3dVector Y = ON_CrossProduct(N,X);
    Y.Unitize();

    t = fabs(ValueAt(P+Y));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P-Y));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P+d*Y));
    if ( t > zero_tolerance )
      zero_tolerance = t;
    t = fabs(ValueAt(P-d*Y));
    if ( t > zero_tolerance )
      zero_tolerance = t;
  }

  return zero_tolerance;
}